

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O2

ostream * operator<<(ostream *out,
                    EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
                    *solution)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *r;
  variant_alternative_t<1UL,_variant<vector<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_allocator<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>_>_>,_SpecificSolution>_>
  *spec;
  variant_alternative_t<0UL,_variant<vector<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_allocator<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>_>_>,_SpecificSolution>_>
  *pvVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  
  if ((solution->
      super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
      ).
      super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      ._M_index == '\0') {
    pvVar1 = std::
             get<0ul,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
                       (solution);
    std::operator<<(out,"(");
    uVar2 = ((long)(pvVar1->
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar1->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x50;
    lVar4 = (uVar2 & 0xffffffff) * 0x50;
    while( true ) {
      if ((int)uVar2 < 2) break;
      poVar3 = boost::multiprecision::operator<<
                         (out,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                               *)((long)(pvVar1->
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                        data._M_elems + lVar4));
      std::operator<<(poVar3,", ");
      uVar2 = (ulong)((int)uVar2 - 1);
      lVar4 = lVar4 + -0x50;
    }
    r = (pvVar1->
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
    if (r != (pvVar1->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
      boost::multiprecision::operator<<(out,r);
    }
    std::operator<<(out,")");
  }
  else {
    spec = std::
           get<1ul,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
                     (solution);
    operator<<(out,spec);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const EquationSolution<ValueType> &solution) {
    std::size_t index = solution.index();
    if (index == 0) {
        const std::vector<ValueType> &vals = std::get<std::vector<ValueType> >(solution);
        out << "(";
        for (int i = int(vals.size()) - 1; i > 0; i--) {
            out << vals[i] << ", ";
        }
        //make sure that we don't have an extra ',' at the end
        if (!vals.empty()) {
            out << vals[0];
        }
        out << ")";
    } else {
        out << std::get<SpecificSolution>(solution);
    }
    return out;
}